

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O3

int tdefl_flush_block(tdefl_compressor *d,int flush)

{
  mz_uint8 *pmVar1;
  tdefl_put_buf_func_ptr p_Var2;
  bool bVar3;
  mz_bool mVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ushort uVar8;
  int iVar9;
  mz_uint *pmVar10;
  uint uVar11;
  long lVar12;
  mz_uint mVar13;
  ulong uVar14;
  uint uVar15;
  mz_uint8 *pmVar16;
  bool bVar17;
  
  if ((d->m_flags & 0x80000) == 0) {
    bVar3 = false;
  }
  else {
    bVar3 = d->m_lookahead_pos - d->m_lz_code_buf_dict_pos <= d->m_dict_size;
  }
  if ((d->m_pPut_buf_func == (tdefl_put_buf_func_ptr)0x0) &&
     (0x14ccb < *d->m_pOut_buf_size - d->m_out_buf_ofs)) {
    pmVar16 = (mz_uint8 *)(d->m_out_buf_ofs + (long)d->m_pOut_buf);
  }
  else {
    pmVar16 = d->m_output_buf;
  }
  d->m_pOutput_buf = pmVar16;
  d->m_pOutput_buf_end = pmVar16 + 0x14cbc;
  if (d->m_output_flush_remaining != 0) {
    __assert_fail("!d->m_output_flush_remaining",
                  "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/src/miniz.h",0xc36
                  ,"int tdefl_flush_block(tdefl_compressor *, int)");
  }
  d->m_output_flush_ofs = 0;
  *d->m_pLZ_flags = *d->m_pLZ_flags >> ((byte)d->m_num_flags_left & 0x1f);
  d->m_pLZ_code_buf = d->m_pLZ_code_buf + -(ulong)(d->m_num_flags_left == 8);
  if (((d->m_flags >> 0xc & 1) != 0) && (d->m_block_index == 0)) {
    pmVar10 = tdefl_write_image_to_png_file_in_memory_ex::s_tdefl_png_num_probes;
    lVar12 = 0;
    do {
      if (*pmVar10 == (d->m_flags & 0xfff)) {
        uVar15 = 0x7800;
        if ((1 < (ulong)-lVar12) && (uVar15 = 0x7840, 5 < (ulong)-lVar12)) {
          uVar15 = (uint)(lVar12 != -6) << 6 | 0x7880;
        }
        goto LAB_00108f45;
      }
      lVar12 = lVar12 + -1;
      pmVar10 = pmVar10 + 1;
    } while (lVar12 != -0xb);
    uVar15 = 0x78c0;
LAB_00108f45:
    uVar5 = d->m_bits_in;
    uVar11 = 0x78 << ((byte)uVar5 & 0x1f) | d->m_bit_buffer;
    d->m_bit_buffer = uVar11;
    uVar7 = uVar5 + 8;
    d->m_bits_in = uVar7;
    if (uVar5 < 0xfffffff8) {
      do {
        pmVar1 = d->m_pOutput_buf;
        if (pmVar1 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar1 + 1;
          *pmVar1 = (mz_uint8)uVar11;
          uVar7 = d->m_bits_in;
          uVar11 = d->m_bit_buffer;
        }
        uVar11 = uVar11 >> 8;
        d->m_bit_buffer = uVar11;
        uVar7 = uVar7 - 8;
        d->m_bits_in = uVar7;
      } while (7 < uVar7);
    }
    uVar11 = ((uVar15 & 0xc0 | uVar15 % 0x1f) ^ 0x1f) << ((byte)uVar7 & 0x1f) | uVar11;
    d->m_bit_buffer = uVar11;
    uVar7 = uVar7 | 8;
    d->m_bits_in = uVar7;
    do {
      pmVar1 = d->m_pOutput_buf;
      if (pmVar1 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar1 + 1;
        *pmVar1 = (mz_uint8)uVar11;
        uVar7 = d->m_bits_in;
        uVar11 = d->m_bit_buffer;
      }
      uVar11 = uVar11 >> 8;
      d->m_bit_buffer = uVar11;
      uVar7 = uVar7 - 8;
      d->m_bits_in = uVar7;
    } while (7 < uVar7);
  }
  mVar13 = (uint)(flush == 4) << ((byte)d->m_bits_in & 0x1f) | d->m_bit_buffer;
  d->m_bit_buffer = mVar13;
  uVar15 = d->m_bits_in + 1;
  d->m_bits_in = uVar15;
  while (7 < uVar15) {
    pmVar1 = d->m_pOutput_buf;
    if (pmVar1 < d->m_pOutput_buf_end) {
      d->m_pOutput_buf = pmVar1 + 1;
      *pmVar1 = (mz_uint8)mVar13;
      uVar15 = d->m_bits_in;
      mVar13 = d->m_bit_buffer;
    }
    mVar13 = mVar13 >> 8;
    d->m_bit_buffer = mVar13;
    uVar15 = uVar15 - 8;
    d->m_bits_in = uVar15;
  }
  pmVar1 = d->m_pOutput_buf;
  bVar17 = true;
  if (bVar3) {
LAB_00109083:
    if (d->m_lookahead_pos - d->m_lz_code_buf_dict_pos <= d->m_dict_size) {
      d->m_pOutput_buf = pmVar1;
      d->m_bit_buffer = mVar13;
      uVar5 = uVar15 + 2;
      d->m_bits_in = uVar5;
      if (uVar15 < 6) {
LAB_00109100:
        d->m_bits_in = 8;
        uVar15 = 8;
        do {
          pmVar1 = d->m_pOutput_buf;
          if (pmVar1 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar1 + 1;
            *pmVar1 = (mz_uint8)mVar13;
            uVar15 = d->m_bits_in;
            mVar13 = d->m_bit_buffer;
          }
          mVar13 = mVar13 >> 8;
          d->m_bit_buffer = mVar13;
          uVar15 = uVar15 - 8;
          d->m_bits_in = uVar15;
        } while (7 < uVar15);
      }
      else {
        do {
          pmVar1 = d->m_pOutput_buf;
          if (pmVar1 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar1 + 1;
            *pmVar1 = (mz_uint8)mVar13;
            uVar5 = d->m_bits_in;
            mVar13 = d->m_bit_buffer;
          }
          mVar13 = mVar13 >> 8;
          d->m_bit_buffer = mVar13;
          uVar5 = uVar5 - 8;
          d->m_bits_in = uVar5;
        } while (7 < uVar5);
        if (uVar5 != 0) goto LAB_00109100;
        uVar15 = 0;
      }
      uVar5 = (uint)(ushort)d->m_total_lz_bytes;
      iVar9 = 2;
      do {
        mVar13 = mVar13 | (uVar5 & 0xffff) << ((byte)uVar15 & 0x1f);
        d->m_bit_buffer = mVar13;
        uVar15 = uVar15 + 0x10;
        d->m_bits_in = uVar15;
        do {
          pmVar1 = d->m_pOutput_buf;
          if (pmVar1 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar1 + 1;
            *pmVar1 = (mz_uint8)mVar13;
            uVar15 = d->m_bits_in;
            mVar13 = d->m_bit_buffer;
          }
          mVar13 = mVar13 >> 8;
          d->m_bit_buffer = mVar13;
          uVar15 = uVar15 - 8;
          d->m_bits_in = uVar15;
        } while (7 < uVar15);
        uVar7 = d->m_total_lz_bytes;
        uVar5 = uVar7 ^ 0xffff;
        d->m_total_lz_bytes = uVar5;
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
      if (uVar7 != 0xffff) {
        uVar5 = 0;
        do {
          mVar13 = mVar13 | (uint)d->m_dict[d->m_lz_code_buf_dict_pos + uVar5 & 0x7fff] <<
                            ((byte)uVar15 & 0x1f);
          d->m_bit_buffer = mVar13;
          uVar15 = uVar15 + 8;
          d->m_bits_in = uVar15;
          do {
            pmVar1 = d->m_pOutput_buf;
            if (pmVar1 < d->m_pOutput_buf_end) {
              d->m_pOutput_buf = pmVar1 + 1;
              *pmVar1 = (mz_uint8)mVar13;
              uVar15 = d->m_bits_in;
              mVar13 = d->m_bit_buffer;
            }
            mVar13 = mVar13 >> 8;
            d->m_bit_buffer = mVar13;
            uVar15 = uVar15 - 8;
            d->m_bits_in = uVar15;
          } while (7 < uVar15);
          uVar5 = uVar5 + 1;
        } while (uVar5 < d->m_total_lz_bytes);
      }
      goto LAB_001091f9;
    }
  }
  else {
    uVar5 = 1;
    if ((d->m_flags & 0x40000) == 0) {
      uVar5 = (uint)(d->m_total_lz_bytes < 0x30);
    }
    mVar4 = tdefl_compress_block(d,uVar5);
    bVar17 = mVar4 == 0;
    if (((ulong)d->m_total_lz_bytes != 0) &&
       ((long)(ulong)d->m_total_lz_bytes <= (long)(d->m_pOutput_buf + (1 - (long)pmVar1))))
    goto LAB_00109083;
  }
  if (bVar17) {
    d->m_pOutput_buf = pmVar1;
    d->m_bit_buffer = mVar13;
    d->m_bits_in = uVar15;
    tdefl_compress_block(d,1);
  }
LAB_001091f9:
  if (flush != 0) {
    if (flush == 4) {
      if (d->m_bits_in == 0) {
        uVar15 = 0;
      }
      else {
        d->m_bits_in = 8;
        uVar5 = d->m_bit_buffer;
        uVar15 = 8;
        do {
          pmVar1 = d->m_pOutput_buf;
          if (pmVar1 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar1 + 1;
            *pmVar1 = (mz_uint8)uVar5;
            uVar15 = d->m_bits_in;
            uVar5 = d->m_bit_buffer;
          }
          uVar5 = uVar5 >> 8;
          d->m_bit_buffer = uVar5;
          uVar15 = uVar15 - 8;
          d->m_bits_in = uVar15;
        } while (7 < uVar15);
      }
      if ((d->m_flags & 0x1000) != 0) {
        uVar5 = d->m_adler32;
        uVar7 = d->m_bit_buffer;
        iVar9 = 0;
        do {
          uVar7 = uVar7 | (uVar5 >> 0x18) << ((byte)uVar15 & 0x1f);
          d->m_bit_buffer = uVar7;
          uVar15 = uVar15 + 8;
          d->m_bits_in = uVar15;
          do {
            pmVar1 = d->m_pOutput_buf;
            if (pmVar1 < d->m_pOutput_buf_end) {
              d->m_pOutput_buf = pmVar1 + 1;
              *pmVar1 = (mz_uint8)uVar7;
              uVar15 = d->m_bits_in;
              uVar7 = d->m_bit_buffer;
            }
            uVar7 = uVar7 >> 8;
            d->m_bit_buffer = uVar7;
            uVar15 = uVar15 - 8;
            d->m_bits_in = uVar15;
          } while (7 < uVar15);
          uVar5 = uVar5 << 8;
          iVar9 = iVar9 + 1;
        } while (iVar9 != 4);
      }
    }
    else {
      uVar15 = d->m_bits_in + 3;
      d->m_bits_in = uVar15;
      uVar5 = d->m_bit_buffer;
      while (7 < uVar15) {
        pmVar1 = d->m_pOutput_buf;
        if (pmVar1 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar1 + 1;
          *pmVar1 = (mz_uint8)uVar5;
          uVar15 = d->m_bits_in;
          uVar5 = d->m_bit_buffer;
        }
        uVar5 = uVar5 >> 8;
        d->m_bit_buffer = uVar5;
        uVar15 = uVar15 - 8;
        d->m_bits_in = uVar15;
      }
      uVar8 = 0;
      if (uVar15 == 0) {
        uVar15 = 0;
      }
      else {
        d->m_bits_in = 8;
        uVar15 = 8;
        do {
          pmVar1 = d->m_pOutput_buf;
          if (pmVar1 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar1 + 1;
            *pmVar1 = (mz_uint8)uVar5;
            uVar15 = d->m_bits_in;
            uVar5 = d->m_bit_buffer;
          }
          uVar5 = uVar5 >> 8;
          d->m_bit_buffer = uVar5;
          uVar15 = uVar15 - 8;
          d->m_bits_in = uVar15;
        } while (7 < uVar15);
      }
      iVar9 = 2;
      do {
        uVar5 = uVar5 | (uint)uVar8 << ((byte)uVar15 & 0x1f);
        d->m_bit_buffer = uVar5;
        uVar15 = uVar15 + 0x10;
        d->m_bits_in = uVar15;
        do {
          pmVar1 = d->m_pOutput_buf;
          if (pmVar1 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar1 + 1;
            *pmVar1 = (mz_uint8)uVar5;
            uVar15 = d->m_bits_in;
            uVar5 = d->m_bit_buffer;
          }
          uVar5 = uVar5 >> 8;
          d->m_bit_buffer = uVar5;
          uVar15 = uVar15 - 8;
          d->m_bits_in = uVar15;
        } while (7 < uVar15);
        uVar8 = uVar8 ^ 0xffff;
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
    }
  }
  pmVar1 = d->m_pOutput_buf;
  if (pmVar1 < d->m_pOutput_buf_end) {
    memset(d->m_huff_count,0,0x280);
    d->m_pLZ_code_buf = d->m_lz_code_buf + 1;
    d->m_pLZ_flags = d->m_lz_code_buf;
    mVar13 = d->m_total_lz_bytes;
    d->m_num_flags_left = 8;
    d->m_total_lz_bytes = 0;
    d->m_lz_code_buf_dict_pos = d->m_lz_code_buf_dict_pos + mVar13;
    d->m_block_index = d->m_block_index + 1;
    iVar9 = (int)pmVar1 - (int)pmVar16;
    if (iVar9 != 0) {
      p_Var2 = d->m_pPut_buf_func;
      if (p_Var2 == (tdefl_put_buf_func_ptr)0x0) {
        uVar6 = (ulong)iVar9;
        if (pmVar16 == d->m_output_buf) {
          uVar14 = *d->m_pOut_buf_size - d->m_out_buf_ofs;
          if (uVar6 < uVar14) {
            uVar14 = uVar6;
          }
          mVar13 = (mz_uint)uVar14;
          memcpy((void *)(d->m_out_buf_ofs + (long)d->m_pOut_buf),d->m_output_buf,(long)(int)mVar13)
          ;
          d->m_out_buf_ofs = d->m_out_buf_ofs + (long)(int)mVar13;
          if (iVar9 - mVar13 != 0) {
            d->m_output_flush_ofs = mVar13;
            d->m_output_flush_remaining = iVar9 - mVar13;
          }
        }
        else {
          d->m_out_buf_ofs = d->m_out_buf_ofs + uVar6;
        }
      }
      else {
        *d->m_pIn_buf_size = (long)d->m_pSrc - (long)d->m_pIn_buf;
        mVar4 = (*p_Var2)(d->m_output_buf,iVar9,d->m_pPut_buf_user);
        if (mVar4 == 0) {
          d->m_prev_return_status = TDEFL_STATUS_PUT_BUF_FAILED;
          return -1;
        }
      }
    }
    return d->m_output_flush_remaining;
  }
  __assert_fail("d->m_pOutput_buf < d->m_pOutput_buf_end",
                "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/src/miniz.h",0xc98,
                "int tdefl_flush_block(tdefl_compressor *, int)");
}

Assistant:

static int tdefl_flush_block(tdefl_compressor *d, int flush) {
  mz_uint saved_bit_buf, saved_bits_in;
  mz_uint8 *pSaved_output_buf;
  mz_bool comp_block_succeeded = MZ_FALSE;
  int n, use_raw_block =
             ((d->m_flags & TDEFL_FORCE_ALL_RAW_BLOCKS) != 0) &&
             (d->m_lookahead_pos - d->m_lz_code_buf_dict_pos) <= d->m_dict_size;
  mz_uint8 *pOutput_buf_start =
      ((d->m_pPut_buf_func == NULL) &&
       ((*d->m_pOut_buf_size - d->m_out_buf_ofs) >= TDEFL_OUT_BUF_SIZE))
          ? ((mz_uint8 *)d->m_pOut_buf + d->m_out_buf_ofs)
          : d->m_output_buf;

  d->m_pOutput_buf = pOutput_buf_start;
  d->m_pOutput_buf_end = d->m_pOutput_buf + TDEFL_OUT_BUF_SIZE - 16;

  MZ_ASSERT(!d->m_output_flush_remaining);
  d->m_output_flush_ofs = 0;
  d->m_output_flush_remaining = 0;

  *d->m_pLZ_flags = (mz_uint8)(*d->m_pLZ_flags >> d->m_num_flags_left);
  d->m_pLZ_code_buf -= (d->m_num_flags_left == 8);

  if ((d->m_flags & TDEFL_WRITE_ZLIB_HEADER) && (!d->m_block_index)) {
    const mz_uint8 cmf = 0x78;
    mz_uint8 flg, flevel = 3;
    mz_uint header, i, mz_un = sizeof(s_tdefl_num_probes) / sizeof(mz_uint);

    /* Determine compression level by reversing the process in
     * tdefl_create_comp_flags_from_zip_params() */
    for (i = 0; i < mz_un; i++)
      if (s_tdefl_num_probes[i] == (d->m_flags & 0xFFF))
        break;

    if (i < 2)
      flevel = 0;
    else if (i < 6)
      flevel = 1;
    else if (i == 6)
      flevel = 2;

    header = cmf << 8 | (flevel << 6);
    header += 31 - (header % 31);
    flg = header & 0xFF;

    TDEFL_PUT_BITS(cmf, 8);
    TDEFL_PUT_BITS(flg, 8);
  }

  TDEFL_PUT_BITS(flush == TDEFL_FINISH, 1);

  pSaved_output_buf = d->m_pOutput_buf;
  saved_bit_buf = d->m_bit_buffer;
  saved_bits_in = d->m_bits_in;

  if (!use_raw_block)
    comp_block_succeeded =
        tdefl_compress_block(d, (d->m_flags & TDEFL_FORCE_ALL_STATIC_BLOCKS) ||
                                    (d->m_total_lz_bytes < 48));

  /* If the block gets expanded, forget the current contents of the output
   * buffer and send a raw block instead. */
  if (((use_raw_block) ||
       ((d->m_total_lz_bytes) && ((d->m_pOutput_buf - pSaved_output_buf + 1U) >=
                                  d->m_total_lz_bytes))) &&
      ((d->m_lookahead_pos - d->m_lz_code_buf_dict_pos) <= d->m_dict_size)) {
    mz_uint i;
    d->m_pOutput_buf = pSaved_output_buf;
    d->m_bit_buffer = saved_bit_buf, d->m_bits_in = saved_bits_in;
    TDEFL_PUT_BITS(0, 2);
    if (d->m_bits_in) {
      TDEFL_PUT_BITS(0, 8 - d->m_bits_in);
    }
    for (i = 2; i; --i, d->m_total_lz_bytes ^= 0xFFFF) {
      TDEFL_PUT_BITS(d->m_total_lz_bytes & 0xFFFF, 16);
    }
    for (i = 0; i < d->m_total_lz_bytes; ++i) {
      TDEFL_PUT_BITS(
          d->m_dict[(d->m_lz_code_buf_dict_pos + i) & TDEFL_LZ_DICT_SIZE_MASK],
          8);
    }
  }
  /* Check for the extremely unlikely (if not impossible) case of the compressed
     block not fitting into the output buffer when using dynamic codes. */
  else if (!comp_block_succeeded) {
    d->m_pOutput_buf = pSaved_output_buf;
    d->m_bit_buffer = saved_bit_buf, d->m_bits_in = saved_bits_in;
    tdefl_compress_block(d, MZ_TRUE);
  }

  if (flush) {
    if (flush == TDEFL_FINISH) {
      if (d->m_bits_in) {
        TDEFL_PUT_BITS(0, 8 - d->m_bits_in);
      }
      if (d->m_flags & TDEFL_WRITE_ZLIB_HEADER) {
        mz_uint i, a = d->m_adler32;
        for (i = 0; i < 4; i++) {
          TDEFL_PUT_BITS((a >> 24) & 0xFF, 8);
          a <<= 8;
        }
      }
    } else {
      mz_uint i, z = 0;
      TDEFL_PUT_BITS(0, 3);
      if (d->m_bits_in) {
        TDEFL_PUT_BITS(0, 8 - d->m_bits_in);
      }
      for (i = 2; i; --i, z ^= 0xFFFF) {
        TDEFL_PUT_BITS(z & 0xFFFF, 16);
      }
    }
  }

  MZ_ASSERT(d->m_pOutput_buf < d->m_pOutput_buf_end);

  memset(&d->m_huff_count[0][0], 0,
         sizeof(d->m_huff_count[0][0]) * TDEFL_MAX_HUFF_SYMBOLS_0);
  memset(&d->m_huff_count[1][0], 0,
         sizeof(d->m_huff_count[1][0]) * TDEFL_MAX_HUFF_SYMBOLS_1);

  d->m_pLZ_code_buf = d->m_lz_code_buf + 1;
  d->m_pLZ_flags = d->m_lz_code_buf;
  d->m_num_flags_left = 8;
  d->m_lz_code_buf_dict_pos += d->m_total_lz_bytes;
  d->m_total_lz_bytes = 0;
  d->m_block_index++;

  if ((n = (int)(d->m_pOutput_buf - pOutput_buf_start)) != 0) {
    if (d->m_pPut_buf_func) {
      *d->m_pIn_buf_size = d->m_pSrc - (const mz_uint8 *)d->m_pIn_buf;
      if (!(*d->m_pPut_buf_func)(d->m_output_buf, n, d->m_pPut_buf_user))
        return (d->m_prev_return_status = TDEFL_STATUS_PUT_BUF_FAILED);
    } else if (pOutput_buf_start == d->m_output_buf) {
      int bytes_to_copy = (int)MZ_MIN(
          (size_t)n, (size_t)(*d->m_pOut_buf_size - d->m_out_buf_ofs));
      memcpy((mz_uint8 *)d->m_pOut_buf + d->m_out_buf_ofs, d->m_output_buf,
             bytes_to_copy);
      d->m_out_buf_ofs += bytes_to_copy;
      if ((n -= bytes_to_copy) != 0) {
        d->m_output_flush_ofs = bytes_to_copy;
        d->m_output_flush_remaining = n;
      }
    } else {
      d->m_out_buf_ofs += n;
    }
  }

  return d->m_output_flush_remaining;
}